

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_gej_cmov(secp256k1_gej *a,secp256k1_gej *b)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  secp256k1_gej t;
  
  memcpy(&t,a,0x98);
  secp256k1_gej_cmov(&t,b,0);
  iVar1 = gej_xyz_equals_gej(&t,a);
  if (iVar1 == 0) {
    pcVar3 = "test condition failed: gej_xyz_equals_gej(&t, a)";
    uVar2 = 0x1011;
  }
  else {
    secp256k1_gej_cmov(&t,b,1);
    iVar1 = gej_xyz_equals_gej(&t,b);
    if (iVar1 != 0) {
      return;
    }
    pcVar3 = "test condition failed: gej_xyz_equals_gej(&t, b)";
    uVar2 = 0x1013;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void test_gej_cmov(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej t = *a;
    secp256k1_gej_cmov(&t, b, 0);
    CHECK(gej_xyz_equals_gej(&t, a));
    secp256k1_gej_cmov(&t, b, 1);
    CHECK(gej_xyz_equals_gej(&t, b));
}